

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::matrixMetric(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *__return_storage_ptr__,
              SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int type)

{
  bool bVar1;
  char cVar2;
  fpclass_type fVar3;
  pointer pnVar4;
  int32_t iVar6;
  undefined8 uVar5;
  int iVar7;
  undefined8 *puVar8;
  long lVar9;
  long lVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  pointer pnVar12;
  undefined4 *puVar13;
  uint *puVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  undefined4 *puVar16;
  uint *puVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  long lVar20;
  byte bVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  uint local_328 [3];
  undefined3 uStack_31b;
  int iStack_318;
  bool abStack_314 [4];
  undefined8 local_310;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  uint local_2a8 [3];
  undefined3 uStack_29b;
  int iStack_298;
  bool bStack_294;
  undefined8 local_290;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [13];
  undefined3 uStack_21b;
  int iStack_218;
  bool bStack_214;
  undefined8 local_210;
  undefined1 local_208 [32];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [13];
  undefined3 uStack_19b;
  int iStack_198;
  bool bStack_194;
  undefined8 local_190;
  uint local_180 [28];
  undefined4 local_110 [28];
  undefined4 local_a0 [28];
  
  bVar21 = 0;
  local_190._0_4_ = cpp_dec_float_finite;
  local_190._4_4_ = 0x1c;
  local_208._0_16_ = (undefined1  [16])0x0;
  local_208._16_16_ = (undefined1  [16])0x0;
  local_1e8 = (undefined1  [16])0x0;
  local_1d8 = (undefined1  [16])0x0;
  local_1c8 = (undefined1  [16])0x0;
  local_1b8 = (undefined1  [16])0x0;
  local_1a8 = SUB1613((undefined1  [16])0x0,0);
  uStack_19b = 0;
  iStack_198 = 0;
  bStack_194 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_208,0.0);
  iVar7 = (*(this->
            super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SLinSolver[4])(this);
  if (iVar7 == 0) {
    (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
    (__return_storage_ptr__->m_backend).prec_elem = 0x1c;
    (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
    pcVar11 = &__return_storage_ptr__->m_backend;
    (pcVar11->data)._M_elems[4] = 0;
    (pcVar11->data)._M_elems[5] = 0;
    (pcVar11->data)._M_elems[6] = 0;
    (pcVar11->data)._M_elems[7] = 0;
    pcVar11 = &__return_storage_ptr__->m_backend;
    (pcVar11->data)._M_elems[8] = 0;
    (pcVar11->data)._M_elems[9] = 0;
    (pcVar11->data)._M_elems[10] = 0;
    (pcVar11->data)._M_elems[0xb] = 0;
    pcVar11 = &__return_storage_ptr__->m_backend;
    (pcVar11->data)._M_elems[0xc] = 0;
    (pcVar11->data)._M_elems[0xd] = 0;
    (pcVar11->data)._M_elems[0xe] = 0;
    (pcVar11->data)._M_elems[0xf] = 0;
    pcVar11 = &__return_storage_ptr__->m_backend;
    (pcVar11->data)._M_elems[0x10] = 0;
    (pcVar11->data)._M_elems[0x11] = 0;
    (pcVar11->data)._M_elems[0x12] = 0;
    (pcVar11->data)._M_elems[0x13] = 0;
    pcVar11 = &__return_storage_ptr__->m_backend;
    (pcVar11->data)._M_elems[0x14] = 0;
    (pcVar11->data)._M_elems[0x15] = 0;
    (pcVar11->data)._M_elems[0x16] = 0;
    (pcVar11->data)._M_elems[0x17] = 0;
    pcVar11 = &__return_storage_ptr__->m_backend;
    (pcVar11->data)._M_elems[0x18] = 0;
    (pcVar11->data)._M_elems[0x19] = 0;
    (pcVar11->data)._M_elems[0x1a] = 0;
    (pcVar11->data)._M_elems[0x1b] = 0;
    *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x6d) = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)__return_storage_ptr__,1.0);
  }
  else {
    if (type == 2) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_208,1.0);
      iVar7 = (*(this->
                super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SLinSolver[4])(this);
      if (0 < iVar7) {
        lVar9 = 0;
        lVar20 = 0;
        do {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_208,
                     (cpp_dec_float<200U,_int,_void> *)
                     ((long)(((this->
                              super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).diag.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar9));
          lVar20 = lVar20 + 1;
          iVar7 = (*(this->
                    super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SLinSolver[4])(this);
          lVar9 = lVar9 + 0x80;
        } while (lVar20 < iVar7);
      }
      local_310._0_4_ = cpp_dec_float_finite;
      local_310._4_4_ = 0x1c;
      local_388 = ZEXT816(0);
      local_378 = ZEXT816(0);
      local_368 = ZEXT816(0);
      local_358 = ZEXT816(0);
      local_348 = ZEXT816(0);
      local_338 = ZEXT816(0);
      local_328[0] = 0;
      local_328[1] = 0;
      stack0xfffffffffffffce0 = 0;
      uStack_31b = 0;
      iStack_318 = 0;
      abStack_314[0] = false;
      local_290._0_4_ = cpp_dec_float_finite;
      local_290._4_4_ = 0x1c;
      local_308 = ZEXT816(0);
      local_2f8 = ZEXT816(0);
      local_2e8 = ZEXT816(0);
      local_2d8 = ZEXT816(0);
      local_2c8 = ZEXT816(0);
      local_2b8 = ZEXT816(0);
      local_2a8[0] = 0;
      local_2a8[1] = 0;
      stack0xfffffffffffffd60 = 0;
      uStack_29b = 0;
      iStack_298 = 0;
      bStack_294 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_308,1.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)local_388,
                 (cpp_dec_float<200U,_int,_void> *)local_308,
                 (cpp_dec_float<200U,_int,_void> *)local_208);
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_388;
      pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_208;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pcVar15->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar21 * -8 + 4);
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar21 * -8 + 4);
      }
      iStack_198 = iStack_318;
      bStack_194 = abStack_314[0];
      local_190._0_4_ = (fpclass_type)local_310;
      local_190._4_4_ = local_310._4_4_;
    }
    else if (type == 1) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_208,0.0);
      iVar7 = (*(this->
                super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SLinSolver[4])(this);
      if (0 < iVar7) {
        lVar20 = 0;
        lVar9 = 0;
        do {
          pnVar4 = (this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).diag.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_310._0_4_ = cpp_dec_float_finite;
          local_310._4_4_ = 0x1c;
          local_388 = (undefined1  [16])0x0;
          local_378 = (undefined1  [16])0x0;
          local_368 = (undefined1  [16])0x0;
          local_358 = (undefined1  [16])0x0;
          local_348 = (undefined1  [16])0x0;
          local_338 = (undefined1  [16])0x0;
          local_328[0] = 0;
          local_328[1] = 0;
          stack0xfffffffffffffce0 = 0;
          uStack_31b = 0;
          iStack_318 = 0;
          abStack_314[0] = false;
          local_290._0_4_ = cpp_dec_float_finite;
          local_290._4_4_ = 0x1c;
          local_308 = (undefined1  [16])0x0;
          local_2f8 = (undefined1  [16])0x0;
          local_2e8 = (undefined1  [16])0x0;
          local_2d8 = (undefined1  [16])0x0;
          local_2c8 = (undefined1  [16])0x0;
          local_2b8 = (undefined1  [16])0x0;
          local_2a8[0] = 0;
          local_2a8[1] = 0;
          stack0xfffffffffffffd60 = 0;
          uStack_29b = 0;
          iStack_298 = 0;
          bStack_294 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_308,1.0);
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)local_388,
                     (cpp_dec_float<200U,_int,_void> *)local_308,
                     (cpp_dec_float<200U,_int,_void> *)
                     ((long)(pnVar4->m_backend).data._M_elems + lVar20));
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)local_208,
                     (cpp_dec_float<200U,_int,_void> *)local_388);
          lVar9 = lVar9 + 1;
          iVar7 = (*(this->
                    super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SLinSolver[4])(this);
          lVar20 = lVar20 + 0x80;
        } while (lVar9 < iVar7);
      }
    }
    else if (type == 0) {
      pnVar4 = (this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).diag.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar12 = pnVar4;
      puVar13 = local_a0;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar13 = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar21 * -2 + 1) * 4);
        puVar13 = puVar13 + (ulong)bVar21 * -2 + 1;
      }
      iVar7 = (pnVar4->m_backend).exp;
      bVar1 = (pnVar4->m_backend).neg;
      bStack_294 = false;
      iStack_298 = 0;
      puVar13 = local_a0;
      puVar16 = (undefined4 *)local_308;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar16 = *puVar13;
        puVar13 = puVar13 + (ulong)bVar21 * -2 + 1;
        puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
      }
      iStack_298 = iVar7;
      bStack_294 = bVar1;
      fVar3 = (pnVar4->m_backend).fpclass;
      iVar6 = (pnVar4->m_backend).prec_elem;
      local_290._0_4_ = fVar3;
      local_290._4_4_ = iVar6;
      if ((bVar1 == true) && (fVar3 != cpp_dec_float_finite || local_308._0_4_ != 0)) {
        bStack_294 = false;
      }
      pnVar12 = pnVar4;
      puVar13 = local_110;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar13 = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar21 * -2 + 1) * 4);
        puVar13 = puVar13 + (ulong)bVar21 * -2 + 1;
      }
      iVar7 = (pnVar4->m_backend).exp;
      bVar1 = (pnVar4->m_backend).neg;
      abStack_314[0] = false;
      iStack_318 = 0;
      puVar13 = local_110;
      puVar16 = (undefined4 *)local_388;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar16 = *puVar13;
        puVar13 = puVar13 + (ulong)bVar21 * -2 + 1;
        puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
      }
      local_310._0_4_ = (pnVar4->m_backend).fpclass;
      local_310._4_4_ = (pnVar4->m_backend).prec_elem;
      abStack_314[0] = bVar1;
      if ((bVar1 == true) &&
         ((fpclass_type)local_310 != cpp_dec_float_finite || local_388._0_4_ != 0)) {
        abStack_314[0] = false;
      }
      iStack_318 = iVar7;
      iVar7 = (*(this->
                super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SLinSolver[4])(this);
      if (1 < iVar7) {
        lVar20 = 1;
        lVar9 = 0xf8;
        do {
          puVar8 = (undefined8 *)
                   ((long)(((this->
                            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).diag.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar9);
          puVar14 = (uint *)(puVar8 + -0xf);
          puVar17 = local_180;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            *puVar17 = *puVar14;
            puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
            puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
          }
          iVar7 = *(int *)(puVar8 + -1);
          cVar2 = *(char *)((long)puVar8 + -4);
          uVar5 = *puVar8;
          local_210._0_4_ = cpp_dec_float_finite;
          local_210._4_4_ = 0x1c;
          bStack_214 = false;
          iStack_218 = 0;
          puVar14 = local_180;
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_288;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pcVar11->data)._M_elems[0] = *puVar14;
            puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar21 * -8 + 4);
          }
          bStack_214 = (bool)cVar2;
          if ((cVar2 == '\x01') &&
             (local_288._0_4_ != 0 || (fpclass_type)uVar5 != cpp_dec_float_finite)) {
            bStack_214 = false;
          }
          iStack_218 = iVar7;
          local_210 = uVar5;
          if (((fpclass_type)uVar5 == cpp_dec_float_NaN) ||
             ((fpclass_type)local_290 == cpp_dec_float_NaN)) {
LAB_0053002c:
            if (((fpclass_type)local_210 != cpp_dec_float_NaN) &&
               ((fpclass_type)local_310 != cpp_dec_float_NaN)) {
              pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_388;
              iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_288,pcVar11);
              if (0 < iVar7) goto LAB_00530054;
            }
          }
          else {
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_308;
            iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_288,pcVar11);
            if (-1 < iVar7) goto LAB_0053002c;
LAB_00530054:
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_288;
            pcVar18 = pcVar11;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pcVar18->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar21 * -8 + 4);
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar21 * -8 + 4);
            }
            pcVar11->exp = iStack_218;
            pcVar11->neg = bStack_214;
            pcVar11->fpclass = (fpclass_type)local_210;
            pcVar11->prec_elem = local_210._4_4_;
          }
          lVar20 = lVar20 + 1;
          iVar7 = (*(this->
                    super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SLinSolver[4])(this);
          lVar9 = lVar9 + 0x80;
        } while (lVar20 < iVar7);
      }
      local_210._0_4_ = cpp_dec_float_finite;
      local_210._4_4_ = 0x1c;
      local_288 = (undefined1  [16])0x0;
      local_278 = (undefined1  [16])0x0;
      local_268 = (undefined1  [16])0x0;
      local_258 = (undefined1  [16])0x0;
      local_248 = (undefined1  [16])0x0;
      local_238 = (undefined1  [16])0x0;
      local_228 = SUB1613((undefined1  [16])0x0,0);
      uStack_21b = 0;
      iStack_218 = 0;
      bStack_214 = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)local_288,
                 (cpp_dec_float<200U,_int,_void> *)local_388,
                 (cpp_dec_float<200U,_int,_void> *)local_308);
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_288;
      puVar14 = (uint *)local_208;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar14 = (pcVar11->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar21 * -8 + 4);
        puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
      }
      iStack_198 = iStack_218;
      bStack_194 = bStack_214;
      local_190._0_4_ = (fpclass_type)local_210;
      local_190._4_4_ = local_210._4_4_;
    }
    puVar14 = (uint *)local_208;
    pnVar19 = __return_storage_ptr__;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = *puVar14;
      puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar21 * -2 + 1) * 4);
    }
    (__return_storage_ptr__->m_backend).exp = iStack_198;
    (__return_storage_ptr__->m_backend).neg = bStack_194;
    (__return_storage_ptr__->m_backend).fpclass = (fpclass_type)local_190;
    (__return_storage_ptr__->m_backend).prec_elem = local_190._4_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

R SLUFactor<R>::matrixMetric(int type) const
{
   R result = 0.0;

   // catch corner case of empty matrix
   if(dim() == 0)
      return 1.0;

   switch(type)
   {
   // compute condition estimate by ratio of max/min of elements on the diagonal
   case 0:
   {
      R mindiag = spxAbs(this->diag[0]);
      R maxdiag = spxAbs(this->diag[0]);

      for(int i = 1; i < dim(); ++i)
      {
         R absdiag = spxAbs(this->diag[i]);

         if(absdiag < mindiag)
            mindiag = absdiag;
         else if(absdiag > maxdiag)
            maxdiag = absdiag;
      }

      result = maxdiag / mindiag;
      break;
   }

   // compute sum of inverses of all elements on the diagonal
   case 1:
      result = 0.0;

      for(int i = 0; i < dim(); ++i)
         result += 1.0 / this->diag[i];

      break;

   // compute determinant (product of all diagonal elements of U)
   case 2:
      result = 1.0;

      for(int i = 0; i < dim(); ++i)
         result *= this->diag[i];

      result = 1.0 / result;
      break;
   }

   return result;
}